

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# act_comm.c
# Opt level: O3

void do_newbie(CHAR_DATA *ch,char *argument)

{
  ulong uVar1;
  bool bVar2;
  char *pcVar3;
  char *pcVar4;
  CHAR_DATA *ch_00;
  char buf [4608];
  char buf2 [4608];
  char acStack_2438 [4608];
  char local_1238 [4616];
  
  if (((0x19 < ch->level) && (bVar2 = is_immortal(ch), !bVar2)) && ((ch->act[0] & 0x1000) == 0)) {
    send_to_char("Huh?\n\r",ch);
    return;
  }
  if (*argument == '\0') {
    if ((ch->comm[0] & 0x40) == 0) {
      send_to_char("Newbie channel is now OFF\n\r",ch);
      *(byte *)ch->comm = (byte)ch->comm[0] | 0x40;
    }
    else {
      send_to_char("Newbie channel is now ON\n\r",ch);
      *(byte *)ch->comm = (byte)ch->comm[0] & 0xbf;
    }
  }
  else {
    sprintf(acStack_2438,": %s",argument);
    uVar1 = ch->comm[0];
    ch->comm[0] = uVar1 & 0xffffffffffffffbf;
    if (((uint)uVar1 >> 10 & 1) == 0) {
      pcVar4 = "[NEWBIE] $n$t";
    }
    else {
      pcVar3 = get_char_color(ch,"newbie");
      END_COLOR(ch);
      pcVar4 = local_1238;
      sprintf(pcVar4,"%s[NEWBIE] $n$t%s",pcVar3);
    }
    act_new(pcVar4,ch,acStack_2438,(void *)0x0,3,0);
    if (char_list != (CHAR_DATA *)0x0) {
      ch_00 = char_list;
      do {
        bVar2 = is_npc(ch_00);
        if (((!bVar2) || (ch_00->desc != (DESCRIPTOR_DATA *)0x0)) &&
           ((((ch_00->level < 0x1a && ((ch_00->comm[0] & 0x40) == 0)) ||
             ((bVar2 = is_immortal(ch_00), bVar2 || (bVar2 = is_heroimm(ch_00), bVar2)))) ||
            ((bVar2 = is_npc(ch_00), bVar2 &&
             ((ch_00->desc != (DESCRIPTOR_DATA *)0x0 &&
              (bVar2 = is_immortal(ch_00->desc->original), bVar2)))))))) {
          pcVar4 = "[NEWBIE] $n$t";
          if ((ch_00->comm[0] & 0x400) != 0) {
            pcVar4 = get_char_color(ch_00,"newbie");
            pcVar3 = END_COLOR(ch_00);
            sprintf(local_1238,"%s[NEWBIE] $n$t%s",pcVar4,pcVar3);
            pcVar4 = local_1238;
          }
          act_new(pcVar4,ch,acStack_2438,ch_00,2,0);
        }
        ch_00 = ch_00->next;
      } while (ch_00 != (CHAR_DATA *)0x0);
    }
  }
  return;
}

Assistant:

void do_newbie(CHAR_DATA *ch, char *argument)
{
	if (ch->level > 25 && !is_immortal(ch) && !IS_SET(ch->act, PLR_HEROIMM))
	{
		send_to_char("Huh?\n\r", ch);
		return;
	}
	else
	{
		if (argument[0] == '\0')
		{
			if (IS_SET(ch->comm, COMM_NONEWBIE))
			{
				send_to_char("Newbie channel is now ON\n\r", ch);
				REMOVE_BIT(ch->comm, COMM_NONEWBIE);
			}
			else
			{
				send_to_char("Newbie channel is now OFF\n\r", ch);
				SET_BIT(ch->comm, COMM_NONEWBIE);
			}

			return;
		}
	}

	if (argument[0] == '\0')
	{
		send_to_char("Syntax: newbie <message>\n\r", ch);
		return;
	}

	char buf[MAX_STRING_LENGTH];
	char buf2[MAX_STRING_LENGTH];
	sprintf(buf, ": %s", argument);

	REMOVE_BIT(ch->comm, COMM_NONEWBIE);

	if (IS_SET(ch->comm, COMM_ANSI))
	{
		sprintf(buf2, "%s[NEWBIE] $n$t%s", get_char_color(ch, "newbie"), END_COLOR(ch));
		act_new(buf2, ch, buf, 0, TO_CHAR, POS_DEAD);
	}
	else
	{
		act_new("[NEWBIE] $n$t", ch, buf, 0, TO_CHAR, POS_DEAD);
	}

	for (auto wch = char_list; wch != nullptr; wch = wch->next)
	{
		if (is_npc(wch) && wch->desc == nullptr)
			continue;

		if ((wch->level <= 25 && !IS_SET(wch->comm, COMM_NONEWBIE)) || is_immortal(wch) || is_heroimm(wch) || (is_npc(wch) && (wch->desc != nullptr) && is_immortal(wch->desc->original)))
		{
			if (IS_SET(wch->comm, COMM_ANSI))
			{
				sprintf(buf2, "%s[NEWBIE] $n$t%s", get_char_color(wch, "newbie"), END_COLOR(wch));
				act_new(buf2, ch, buf, wch, TO_VICT, POS_DEAD);
			}
			else
				act_new("[NEWBIE] $n$t", ch, buf, wch, TO_VICT, POS_DEAD);
		}
	}
}